

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  void *this;
  double dVar2;
  uint local_7c;
  uint i_2;
  double roots [4];
  uint local_50;
  uint i_1;
  uint i;
  uint j;
  double ce [4];
  uint local_1c;
  uint counts;
  char **argv_local;
  int argc_local;
  
  testEigen();
  _i = 1.87832;
  ce[0] = -0.0950376;
  ce[1] = -1.87832;
  ce[2] = -0.882024;
  i_1 = 5;
  if ((uint)argc < 5) {
    i_1 = argc;
  }
  for (local_50 = 1; local_50 < i_1; local_50 = local_50 + 1) {
    dVar2 = strtod(argv[local_50],(char **)0x0);
    *(double *)(&i + (ulong)(local_50 - 1) * 2) = dVar2;
  }
  std::operator<<((ostream *)&std::cout,"x^4");
  if (argc == 1) {
    i_1 = 4;
  }
  else {
    i_1 = i_1 - 1;
  }
  for (roots[3]._4_4_ = 0; roots[3]._4_4_ < i_1; roots[3]._4_4_ = roots[3]._4_4_ + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout," + (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(&i + (ulong)roots[3]._4_4_ * 2))
    ;
    std::operator<<(poVar1,")");
    if (roots[3]._4_4_ == 3) {
      std::operator<<((ostream *)&std::cout," =0\n");
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"*x^");
      std::ostream::operator<<(poVar1,3 - roots[3]._4_4_);
    }
  }
  if (i_1 == 3) {
    std::operator<<((ostream *)&std::cout,"cubic:\n");
    local_1c = cubicSolver((double *)&i,(double *)&stack0xffffffffffffff88);
  }
  else if (i_1 == 4) {
    std::operator<<((ostream *)&std::cout,"quadratic:\n");
    local_1c = quarticSolver((double *)&i,(double *)&stack0xffffffffffffff88);
  }
  else {
    std::operator<<((ostream *)&std::cout,"quartic:\n");
    local_1c = quadraticSolver((double *)&i,(double *)&stack0xffffffffffffff88);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of real roots=");
  this = (void *)std::ostream::operator<<(poVar1,local_1c);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_7c = 0; local_7c < local_1c; local_7c = local_7c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"x= ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(double *)(&stack0xffffffffffffff88 + (ulong)local_7c * 8));
    std::operator<<(poVar1,'\t');
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char * argv[])
{
    testEigen();
    unsigned int counts;
    double ce[4]= {1.87832,-0.0950376,-1.87832,-0.882024};
    unsigned int j=5;
    if(argc < j ) j=argc;
    for(unsigned int i=1; i< j; i++) {
        ce[i-1]=strtod(argv[i],NULL);
    }
    std::cout<<"x^4";
    if(argc == 1) j=4;
    else j--;
    for(unsigned int i=0; i< j; i++) {
        std::cout<<" + ("<<ce[i]<<")";
        if ( i != 3 ) {
            std::cout<<"*x^"<<3-i;
        } else {
            std::cout<<" =0\n";
        }
    }

    double roots[4];
    switch (j) {
    case 4:
        std::cout<<"quadratic:\n";
        counts=quarticSolver(ce,roots);
        break;
    case 3:
        std::cout<<"cubic:\n";
        counts=cubicSolver(ce,roots);
        break;
    default:
        std::cout<<"quartic:\n";
        counts=quadraticSolver(ce,roots);
    }
    std::cout<<"Number of real roots="<<counts<<std::endl;
    for(unsigned int i=0; i<counts; i++) {
        std::cout<<"x= "<<roots[i]<<'\t';
    }
    std::cout<<std::endl;
    return 0;


}